

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall QMessageBox::removeButton(QMessageBox *this,QAbstractButton *button)

{
  long lVar1;
  QMessageBoxPrivate *this_00;
  QPushButton *in_RSI;
  long in_FS_OFFSET;
  QMessageBoxPrivate *d;
  QAbstractButton *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QMessageBox *)0x7a4daa);
  QList<QAbstractButton*>::removeAll<QAbstractButton*>
            ((QList<QAbstractButton_*> *)this_00,(QAbstractButton **)in_stack_ffffffffffffffd8);
  if ((QPushButton *)this_00->escapeButton == in_RSI) {
    this_00->escapeButton = (QAbstractButton *)0x0;
  }
  if (this_00->defaultButton == in_RSI) {
    this_00->defaultButton = (QPushButton *)0x0;
  }
  QDialogButtonBox::removeButton((QDialogButtonBox *)this_00,in_stack_ffffffffffffffd8);
  QMessageBoxPrivate::updateSize(d);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBox::removeButton(QAbstractButton *button)
{
    Q_D(QMessageBox);
    d->customButtonList.removeAll(button);
    if (d->escapeButton == button)
        d->escapeButton = nullptr;
    if (d->defaultButton == button)
        d->defaultButton = nullptr;
    d->buttonBox->removeButton(button);
    d->updateSize();
}